

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_mark_ins(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  int iVar3;
  jit_State *in_RDI;
  IRIns *irr;
  IRIns *irl;
  IRIns *ira;
  IRIns *irlast;
  IRIns *ir;
  IRIns *in_stack_ffffffffffffffd8;
  IRRef ref;
  IRIns *in_stack_ffffffffffffffe0;
  IRIns *J_00;
  IRIns *local_10;
  
  J_00 = (in_RDI->cur).ir + ((in_RDI->cur).nins - 1);
  local_10 = J_00;
  do {
    ref = (IRRef)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    switch((local_10->field_1).o) {
    case '\r':
      return;
    default:
      if ((((local_10->field_1).t.irt & 0x20) != 0) || (((local_10->field_1).t.irt & 0x80) != 0)) {
        if (0x8000 < (local_10->field_0).op1) {
          pIVar2 = (in_RDI->cur).ir;
          *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) =
               *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) | 0x20;
        }
        if (0x8000 < (local_10->field_0).op2) {
          pIVar2 = (in_RDI->cur).ir;
          *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) =
               *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) | 0x20;
        }
      }
      break;
    case '\x13':
      in_stack_ffffffffffffffd8 = (in_RDI->cur).ir + (local_10->field_0).op1;
      pIVar2 = (in_RDI->cur).ir;
      uVar1 = (local_10->field_0).op2;
      (&pIVar2->field_0)[uVar1].prev = 0;
      (in_stack_ffffffffffffffd8->field_0).prev = 0;
      if (((in_stack_ffffffffffffffd8->field_1).o != (&pIVar2->field_1)[uVar1].o) ||
         (((((in_stack_ffffffffffffffd8->field_1).o != 'N' &&
            ((in_stack_ffffffffffffffd8->field_1).o != 'O')) &&
           ((in_stack_ffffffffffffffd8->field_1).o != 'P')) &&
          ((in_stack_ffffffffffffffd8->field_1).o != 'Q')))) {
        (in_stack_ffffffffffffffd8->field_1).t.irt =
             (in_stack_ffffffffffffffd8->field_1).t.irt | 0x20;
        (&pIVar2->field_1)[uVar1].t.irt = (&pIVar2->field_1)[uVar1].t.irt | 0x20;
      }
      break;
    case '@':
    case 'A':
    case 'D':
    case 'R':
    case 'Z':
      pIVar2 = (in_RDI->cur).ir;
      *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) =
           *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) | 0x20;
      break;
    case 'C':
      if ((((local_10->field_1).t.irt & 0x20) != 0) || ((local_10->field_0).op2 == 3)) {
        pIVar2 = (in_RDI->cur).ir;
        *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) =
             *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) | 0x20;
      }
      break;
    case 'G':
    case 'H':
    case 'J':
    case 'K':
      in_stack_ffffffffffffffe0 = sink_checkalloc(in_RDI,local_10);
      if ((in_stack_ffffffffffffffe0 == (IRIns *)0x0) ||
         ((((in_stack_ffffffffffffffe0->field_1).t.irt & 0x40) != 0 &&
          (iVar3 = sink_checkphi((jit_State *)&J_00->field_0,in_stack_ffffffffffffffe0,ref),
          iVar3 == 0)))) {
        pIVar2 = (in_RDI->cur).ir;
        *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) =
             *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) | 0x20;
      }
      pIVar2 = (in_RDI->cur).ir;
      *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) =
           *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) | 0x20;
      break;
    case 'Q':
      if ((((local_10->field_1).t.irt & 0x40) != 0) &&
         (iVar3 = sink_checkphi((jit_State *)&J_00->field_0,in_stack_ffffffffffffffe0,ref),
         iVar3 == 0)) {
        (local_10->field_1).t.irt = (local_10->field_1).t.irt | 0x20;
      }
    case 'I':
      pIVar2 = (in_RDI->cur).ir;
      *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) =
           *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op2 * 8 + 4) | 0x20;
      break;
    case '[':
    case '\\':
      pIVar2 = (in_RDI->cur).ir;
      *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) =
           *(byte *)((long)pIVar2 + (ulong)(local_10->field_0).op1 * 8 + 4) | 0x20;
    }
    local_10 = local_10 + -1;
  } while( true );
}

Assistant:

static void sink_mark_ins(jit_State *J)
{
  IRIns *ir, *irlast = IR(J->cur.nins-1);
  for (ir = irlast ; ; ir--) {
    switch (ir->o) {
    case IR_BASE:
      return;  /* Finished. */
    case IR_CALLL:  /* IRCALL_lj_tab_len */
    case IR_ALOAD: case IR_HLOAD: case IR_XLOAD: case IR_TBAR:
      irt_setmark(IR(ir->op1)->t);  /* Mark ref for remaining loads. */
      break;
    case IR_FLOAD:
      if (irt_ismarked(ir->t) || ir->op2 == IRFL_TAB_META)
	irt_setmark(IR(ir->op1)->t);  /* Mark table for remaining loads. */
      break;
    case IR_ASTORE: case IR_HSTORE: case IR_FSTORE: case IR_XSTORE: {
      IRIns *ira = sink_checkalloc(J, ir);
      if (!ira || (irt_isphi(ira->t) && !sink_checkphi(J, ira, ir->op2)))
	irt_setmark(IR(ir->op1)->t);  /* Mark ineligible ref. */
      irt_setmark(IR(ir->op2)->t);  /* Mark stored value. */
      break;
      }
#if LJ_HASFFI
    case IR_CNEWI:
      if (irt_isphi(ir->t) &&
	  (!sink_checkphi(J, ir, ir->op2) ||
	   (LJ_32 && ir+1 < irlast && (ir+1)->o == IR_HIOP &&
	    !sink_checkphi(J, ir, (ir+1)->op2))))
	irt_setmark(ir->t);  /* Mark ineligible allocation. */
      /* fallthrough */
#endif
    case IR_USTORE:
      irt_setmark(IR(ir->op2)->t);  /* Mark stored value. */
      break;
#if LJ_HASFFI
    case IR_CALLXS:
#endif
    case IR_CALLS:
      irt_setmark(IR(ir->op1)->t);  /* Mark (potentially) stored values. */
      break;
    case IR_PHI: {
      IRIns *irl = IR(ir->op1), *irr = IR(ir->op2);
      irl->prev = irr->prev = 0;  /* Clear PHI value counts. */
      if (irl->o == irr->o &&
	  (irl->o == IR_TNEW || irl->o == IR_TDUP ||
	   (LJ_HASFFI && (irl->o == IR_CNEW || irl->o == IR_CNEWI))))
	break;
      irt_setmark(irl->t);
      irt_setmark(irr->t);
      break;
      }
    default:
      if (irt_ismarked(ir->t) || irt_isguard(ir->t)) {  /* Propagate mark. */
	if (ir->op1 >= REF_FIRST) irt_setmark(IR(ir->op1)->t);
	if (ir->op2 >= REF_FIRST) irt_setmark(IR(ir->op2)->t);
      }
      break;
    }
  }
}